

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbitblb.cpp
# Opt level: O1

void __thiscall icu_63::RBBITableBuilder::buildStateTable(RBBITableBuilder *this)

{
  bool bVar1;
  UBool UVar2;
  int32_t iVar3;
  RBBIStateDescriptor *this_00;
  UVector *pUVar4;
  RBBIStateDescriptor *this_01;
  char *pcVar5;
  int *piVar6;
  RBBIStateDescriptor *this_02;
  void *pvVar7;
  UErrorCode *pUVar8;
  uint uVar9;
  RBBIStateDescriptor *in_RSI;
  RBBIStateDescriptor *other;
  uint lastInputSymbol;
  int iVar10;
  uint local_58;
  int local_54;
  
  if (U_ZERO_ERROR < *this->fStatus) {
    return;
  }
  iVar3 = RBBISetBuilder::getNumCharCategories(this->fRB->fSetBuilder);
  lastInputSymbol = iVar3 - 1;
  this_00 = (RBBIStateDescriptor *)UMemory::operator_new((UMemory *)0x30,(size_t)in_RSI);
  if (this_00 == (RBBIStateDescriptor *)0x0) {
    this_00 = (RBBIStateDescriptor *)0x0;
  }
  else {
    in_RSI = (RBBIStateDescriptor *)(ulong)lastInputSymbol;
    RBBIStateDescriptor::RBBIStateDescriptor(this_00,lastInputSymbol,this->fStatus);
  }
  if (this_00 == (RBBIStateDescriptor *)0x0) {
    pUVar8 = this->fStatus;
LAB_0015a78b:
    *pUVar8 = U_MEMORY_ALLOCATION_ERROR;
  }
  else {
    pUVar4 = (UVector *)UMemory::operator_new((UMemory *)0x28,(size_t)in_RSI);
    if (pUVar4 == (UVector *)0x0) {
      pUVar4 = (UVector *)0x0;
    }
    else {
      in_RSI = (RBBIStateDescriptor *)this->fStatus;
      UVector::UVector(pUVar4,(UErrorCode *)in_RSI);
    }
    this_00->fPositions = pUVar4;
    pUVar8 = this->fStatus;
    if (pUVar4 == (UVector *)0x0) goto LAB_0015a78b;
    if ((*pUVar8 < U_ILLEGAL_ARGUMENT_ERROR) &&
       (in_RSI = this_00, UVector::addElement(this->fDStates,this_00,pUVar8),
       *this->fStatus < U_ILLEGAL_ARGUMENT_ERROR)) {
      this_01 = (RBBIStateDescriptor *)UMemory::operator_new((UMemory *)0x30,(size_t)in_RSI);
      if (this_01 == (RBBIStateDescriptor *)0x0) {
        this_01 = (RBBIStateDescriptor *)0x0;
      }
      else {
        in_RSI = (RBBIStateDescriptor *)(ulong)lastInputSymbol;
        RBBIStateDescriptor::RBBIStateDescriptor(this_01,lastInputSymbol,this->fStatus);
      }
      if (this_01 == (RBBIStateDescriptor *)0x0) {
        *this->fStatus = U_MEMORY_ALLOCATION_ERROR;
      }
      if (*this->fStatus < U_ILLEGAL_ARGUMENT_ERROR) {
        pUVar4 = (UVector *)UMemory::operator_new((UMemory *)0x28,(size_t)in_RSI);
        if (pUVar4 == (UVector *)0x0) {
          pUVar4 = (UVector *)0x0;
        }
        else {
          in_RSI = (RBBIStateDescriptor *)this->fStatus;
          UVector::UVector(pUVar4,(UErrorCode *)in_RSI);
        }
        this_01->fPositions = pUVar4;
        if (pUVar4 == (UVector *)0x0) {
          *this->fStatus = U_MEMORY_ALLOCATION_ERROR;
        }
        if (*this->fStatus < U_ILLEGAL_ARGUMENT_ERROR) {
          setAdd(this,pUVar4,(*this->fTree)->fFirstPosSet);
          in_RSI = this_01;
          UVector::addElement(this->fDStates,this_01,this->fStatus);
          if (*this->fStatus < U_ILLEGAL_ARGUMENT_ERROR) {
            do {
              pUVar4 = this->fDStates;
              if (pUVar4->count < 2) {
                pcVar5 = (char *)0x0;
              }
              else {
                uVar9 = 1;
                do {
                  in_RSI = (RBBIStateDescriptor *)(ulong)uVar9;
                  pcVar5 = (char *)UVector::elementAt(pUVar4,uVar9);
                  if (*pcVar5 == '\0') break;
                  uVar9 = uVar9 + 1;
                  pUVar4 = this->fDStates;
                  pcVar5 = (char *)0x0;
                } while ((int)uVar9 < pUVar4->count);
              }
              if (pcVar5 == (char *)0x0) {
                iVar10 = 3;
              }
              else {
                *pcVar5 = '\x01';
                if (1 < iVar3) {
                  local_54 = 1;
                  do {
                    pUVar4 = *(UVector **)(pcVar5 + 0x20);
                    if (pUVar4->count < 1) {
                      this_02 = (RBBIStateDescriptor *)0x0;
                      other = in_RSI;
                    }
                    else {
                      this_02 = (RBBIStateDescriptor *)0x0;
                      in_RSI = (RBBIStateDescriptor *)0x0;
                      do {
                        iVar10 = (int)in_RSI;
                        piVar6 = (int *)UVector::elementAt(pUVar4,iVar10);
                        if ((*piVar6 == 3) && (piVar6[0x1f] == local_54)) {
                          if (this_02 == (RBBIStateDescriptor *)0x0) {
                            this_02 = (RBBIStateDescriptor *)
                                      UMemory::operator_new((UMemory *)0x28,(size_t)in_RSI);
                            if (this_02 == (RBBIStateDescriptor *)0x0) {
                              this_02 = (RBBIStateDescriptor *)0x0;
                            }
                            else {
                              in_RSI = (RBBIStateDescriptor *)this->fStatus;
                              UVector::UVector((UVector *)this_02,(UErrorCode *)in_RSI);
                            }
                            if (this_02 == (RBBIStateDescriptor *)0x0) {
                              *this->fStatus = U_MEMORY_ALLOCATION_ERROR;
                              iVar10 = 2;
                              goto LAB_0015aa77;
                            }
                          }
                          in_RSI = this_02;
                          setAdd(this,(UVector *)this_02,*(UVector **)(piVar6 + 0x26));
                        }
                        uVar9 = iVar10 + 1;
                        pUVar4 = *(UVector **)(pcVar5 + 0x20);
                        other = in_RSI;
                        in_RSI = (RBBIStateDescriptor *)(ulong)uVar9;
                      } while ((int)uVar9 < pUVar4->count);
                    }
                    in_RSI = other;
                    if (this_02 == (RBBIStateDescriptor *)0x0) {
LAB_0015aa75:
                      iVar10 = 0;
                    }
                    else {
                      pUVar4 = this->fDStates;
                      if (pUVar4->count < 1) {
                        bVar1 = true;
                        local_58 = 0;
                      }
                      else {
                        uVar9 = 0;
                        bVar1 = false;
                        local_58 = 0;
                        do {
                          pvVar7 = UVector::elementAt(pUVar4,uVar9);
                          other = *(RBBIStateDescriptor **)((long)pvVar7 + 0x20);
                          UVar2 = UVector::equals((UVector *)this_02,(UVector *)other);
                          if (UVar2 != '\0') {
                            (**(code **)(*(long *)this_02 + 8))(this_02);
                            this_02 = *(RBBIStateDescriptor **)((long)pvVar7 + 0x20);
                            bVar1 = true;
                            local_58 = uVar9;
                            break;
                          }
                          uVar9 = uVar9 + 1;
                          pUVar4 = this->fDStates;
                        } while ((int)uVar9 < pUVar4->count);
                        bVar1 = !bVar1;
                      }
                      if (bVar1) {
                        in_RSI = (RBBIStateDescriptor *)
                                 UMemory::operator_new((UMemory *)0x30,(size_t)other);
                        if (in_RSI == (RBBIStateDescriptor *)0x0) {
                          in_RSI = (RBBIStateDescriptor *)0x0;
                        }
                        else {
                          other = (RBBIStateDescriptor *)(ulong)lastInputSymbol;
                          RBBIStateDescriptor::RBBIStateDescriptor
                                    (in_RSI,lastInputSymbol,this->fStatus);
                        }
                        if (in_RSI == (RBBIStateDescriptor *)0x0) {
                          *this->fStatus = U_MEMORY_ALLOCATION_ERROR;
                        }
                        pUVar8 = this->fStatus;
                        if (*pUVar8 < U_ILLEGAL_ARGUMENT_ERROR) {
                          in_RSI->fPositions = (UVector *)this_02;
                          UVector::addElement(this->fDStates,in_RSI,pUVar8);
                          iVar10 = 0;
                          if (U_ZERO_ERROR < *this->fStatus) {
                            iVar10 = 1;
                            goto LAB_0015aa56;
                          }
                          local_58 = this->fDStates->count - 1;
                          bVar1 = true;
                        }
                        else {
                          iVar10 = 2;
                          in_RSI = other;
LAB_0015aa56:
                          bVar1 = false;
                        }
                        if (bVar1) goto LAB_0015aa5f;
                      }
                      else {
LAB_0015aa5f:
                        in_RSI = (RBBIStateDescriptor *)(ulong)local_58;
                        UVector32::setElementAt(*(UVector32 **)(pcVar5 + 0x28),local_58,local_54);
                        iVar10 = 0;
                      }
                      if (iVar10 == 0) goto LAB_0015aa75;
                    }
LAB_0015aa77:
                    if (iVar10 != 0) goto LAB_0015aabe;
                    local_54 = local_54 + 1;
                  } while (local_54 != iVar3);
                }
                iVar10 = 0;
              }
LAB_0015aabe:
            } while (iVar10 == 0);
            if (iVar10 != 2) {
              return;
            }
          }
        }
      }
      goto LAB_0015a794;
    }
  }
  this_01 = (RBBIStateDescriptor *)0x0;
LAB_0015a794:
  if (this_01 != (RBBIStateDescriptor *)0x0) {
    RBBIStateDescriptor::~RBBIStateDescriptor(this_01);
    UMemory::operator_delete((UMemory *)this_01,in_RSI);
  }
  if (this_00 == (RBBIStateDescriptor *)0x0) {
    return;
  }
  RBBIStateDescriptor::~RBBIStateDescriptor(this_00);
  UMemory::operator_delete((UMemory *)this_00,in_RSI);
  return;
}

Assistant:

void RBBITableBuilder::buildStateTable() {
    if (U_FAILURE(*fStatus)) {
        return;
    }
    RBBIStateDescriptor *failState;
    // Set it to NULL to avoid uninitialized warning
    RBBIStateDescriptor *initialState = NULL; 
    //
    // Add a dummy state 0 - the stop state.  Not from Aho.
    int      lastInputSymbol = fRB->fSetBuilder->getNumCharCategories() - 1;
    failState = new RBBIStateDescriptor(lastInputSymbol, fStatus);
    if (failState == NULL) {
        *fStatus = U_MEMORY_ALLOCATION_ERROR;
        goto ExitBuildSTdeleteall;
    }
    failState->fPositions = new UVector(*fStatus);
    if (failState->fPositions == NULL) {
        *fStatus = U_MEMORY_ALLOCATION_ERROR;
    }
    if (failState->fPositions == NULL || U_FAILURE(*fStatus)) {
        goto ExitBuildSTdeleteall;
    }
    fDStates->addElement(failState, *fStatus);
    if (U_FAILURE(*fStatus)) {
        goto ExitBuildSTdeleteall;
    }

    // initially, the only unmarked state in Dstates is firstpos(root),
    //       where toot is the root of the syntax tree for (r)#;
    initialState = new RBBIStateDescriptor(lastInputSymbol, fStatus);
    if (initialState == NULL) {
        *fStatus = U_MEMORY_ALLOCATION_ERROR;
    }
    if (U_FAILURE(*fStatus)) {
        goto ExitBuildSTdeleteall;
    }
    initialState->fPositions = new UVector(*fStatus);
    if (initialState->fPositions == NULL) {
        *fStatus = U_MEMORY_ALLOCATION_ERROR;
    }
    if (U_FAILURE(*fStatus)) {
        goto ExitBuildSTdeleteall;
    }
    setAdd(initialState->fPositions, fTree->fFirstPosSet);
    fDStates->addElement(initialState, *fStatus);
    if (U_FAILURE(*fStatus)) {
        goto ExitBuildSTdeleteall;
    }

    // while there is an unmarked state T in Dstates do begin
    for (;;) {
        RBBIStateDescriptor *T = NULL;
        int32_t              tx;
        for (tx=1; tx<fDStates->size(); tx++) {
            RBBIStateDescriptor *temp;
            temp = (RBBIStateDescriptor *)fDStates->elementAt(tx);
            if (temp->fMarked == FALSE) {
                T = temp;
                break;
            }
        }
        if (T == NULL) {
            break;
        }

        // mark T;
        T->fMarked = TRUE;

        // for each input symbol a do begin
        int32_t  a;
        for (a = 1; a<=lastInputSymbol; a++) {
            // let U be the set of positions that are in followpos(p)
            //    for some position p in T
            //    such that the symbol at position p is a;
            UVector    *U = NULL;
            RBBINode   *p;
            int32_t     px;
            for (px=0; px<T->fPositions->size(); px++) {
                p = (RBBINode *)T->fPositions->elementAt(px);
                if ((p->fType == RBBINode::leafChar) &&  (p->fVal == a)) {
                    if (U == NULL) {
                        U = new UVector(*fStatus);
                        if (U == NULL) {
                        	*fStatus = U_MEMORY_ALLOCATION_ERROR;
                        	goto ExitBuildSTdeleteall;
                        }
                    }
                    setAdd(U, p->fFollowPos);
                }
            }

            // if U is not empty and not in DStates then
            int32_t  ux = 0;
            UBool    UinDstates = FALSE;
            if (U != NULL) {
                U_ASSERT(U->size() > 0);
                int  ix;
                for (ix=0; ix<fDStates->size(); ix++) {
                    RBBIStateDescriptor *temp2;
                    temp2 = (RBBIStateDescriptor *)fDStates->elementAt(ix);
                    if (setEquals(U, temp2->fPositions)) {
                        delete U;
                        U  = temp2->fPositions;
                        ux = ix;
                        UinDstates = TRUE;
                        break;
                    }
                }

                // Add U as an unmarked state to Dstates
                if (!UinDstates)
                {
                    RBBIStateDescriptor *newState = new RBBIStateDescriptor(lastInputSymbol, fStatus);
                    if (newState == NULL) {
                    	*fStatus = U_MEMORY_ALLOCATION_ERROR;
                    }
                    if (U_FAILURE(*fStatus)) {
                        goto ExitBuildSTdeleteall;
                    }
                    newState->fPositions = U;
                    fDStates->addElement(newState, *fStatus);
                    if (U_FAILURE(*fStatus)) {
                        return;
                    }
                    ux = fDStates->size()-1;
                }

                // Dtran[T, a] := U;
                T->fDtran->setElementAt(ux, a);
            }
        }
    }
    return;
    // delete local pointers only if error occured.
ExitBuildSTdeleteall:
    delete initialState;
    delete failState;
}